

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O1

void __thiscall SPTest_OrderVarsByStage_Test::TestBody(SPTest_OrderVarsByStage_Test *this)

{
  bool bVar1;
  SuffixHandler<int> SVar2;
  ulong uVar3;
  ulong uVar4;
  _func_int *message;
  char *pcVar5;
  StringRef name;
  AssertionResult gtest_ar_1;
  SPAdapter sp;
  TestBasicProblem p;
  AssertHelper local_620;
  AssertHelper local_618;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_610;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_608;
  SPAdapter local_600;
  TestBasicProblem local_3b8;
  
  TestBasicProblem::TestBasicProblem(&local_3b8,2,1);
  local_610.ptr_._0_4_ = 1;
  local_620.data_ =
       (AssertHelperData *)
       (CONCAT44(local_620.data_._4_4_,
                 (uint)*local_3b8.super_TestProblem.super_ColProblem.super_Problem.is_var_int_.
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_start.super__Bit_iterator_base._M_p >> 1) & 0xffffffff00000001);
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            ((internal *)&local_600,"mp::var::INTEGER","p.var(1).type()",(Type *)&local_610,
             (Type *)&local_620);
  if ((char)local_600.problem_ == '\0') {
    testing::Message::Message((Message *)&local_610);
    if (local_600.factory_._vptr_BasicExprFactory == (_func_int **)0x0) {
      message = (_func_int *)0x17388b;
    }
    else {
      message = *local_600.factory_._vptr_BasicExprFactory;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x154,
               (char *)message);
    testing::internal::AssertHelper::operator=(&local_620,(Message *)&local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    if (local_610.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_610.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_610.ptr_ + 8))();
      }
      local_610.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_600.factory_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  (local_3b8.super_TestProblem.super_ColProblem.super_Problem.vars_.
   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
   ._M_impl.super__Vector_impl_data._M_start)->lb = 42.0;
  name.size_ = 5;
  name.data_ = "stage";
  SVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<int>
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_3b8,name,0);
  **(undefined4 **)((long)SVar2.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) = 2;
  mp::SPAdapter::SPAdapter(&local_600,(ColProblem *)&local_3b8);
  local_620.data_._0_4_ = 1;
  uVar3 = (ulong)*local_600.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
  uVar4 = uVar3 + 0x3f;
  if (-1 < (long)uVar3) {
    uVar4 = uVar3;
  }
  local_618.data_._0_4_ =
       (uint)((*(ulong *)(((long)uVar4 >> 6) * 8 +
                          *(long *)(CONCAT71(local_600.problem_._1_7_,(char)local_600.problem_) +
                                   0x180) + -8 +
                         (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar3 & 0x3f) & 1) != 0);
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            ((internal *)&local_610,"mp::var::INTEGER","sp.var(0).type()",(Type *)&local_620,
             (Type *)&local_618);
  if (local_610.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_620);
    if (local_608.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_608.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x158,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if (local_620.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_620.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_620.data_ + 8))();
      }
      local_620.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_608,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_620.data_ = local_620.data_ & 0xffffffff00000000;
  uVar3 = (ulong)local_600.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
  uVar4 = uVar3 + 0x3f;
  if (-1 < (long)uVar3) {
    uVar4 = uVar3;
  }
  local_618.data_._0_4_ =
       (uint)((*(ulong *)(((long)uVar4 >> 6) * 8 +
                          *(long *)(CONCAT71(local_600.problem_._1_7_,(char)local_600.problem_) +
                                   0x180) + -8 +
                         (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar3 & 0x3f) & 1) != 0);
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            ((internal *)&local_610,"mp::var::CONTINUOUS","sp.var(1).type()",(Type *)&local_620,
             (Type *)&local_618);
  if (local_610.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_620);
    if (local_608.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_608.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x159,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if (local_620.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_620.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_620.data_ + 8))();
      }
      local_620.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_608,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_618.data_._0_4_ = 0x2a;
  local_620.data_ =
       *(AssertHelperData **)
        (*(long *)(CONCAT71(local_600.problem_._1_7_,(char)local_600.problem_) + 0x168) +
        (long)local_600.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[1] * 0x10);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_610,"42","sp.var(1).lb()",(int *)&local_618,(double *)&local_620);
  if (local_610.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_620);
    if (local_608.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_608.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x15a,
               pcVar5);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if (local_620.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_620.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_620.data_ + 8))();
      }
      local_620.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_608,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::SPAdapter::~SPAdapter(&local_600);
  local_3b8.super_TestProblem.super_ColProblem.super_Problem.super_ExprFactory.
  _vptr_BasicExprFactory = (_func_int **)&PTR__ColProblem_00199678;
  local_3b8.super_TestProblem.super_ColProblem.super_Problem.super_SuffixManager._vptr_SuffixManager
       = (_func_int **)&PTR__ColProblem_00199698;
  if (local_3b8.super_TestProblem.super_ColProblem.coefs_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_3b8.super_TestProblem.super_ColProblem.coefs_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b8.super_TestProblem.super_ColProblem.coefs_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super_TestProblem.super_ColProblem.coefs_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3b8.super_TestProblem.super_ColProblem.row_indices_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_3b8.super_TestProblem.super_ColProblem.row_indices_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_3b8.super_TestProblem.super_ColProblem.row_indices_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_3b8.super_TestProblem.super_ColProblem.row_indices_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_3b8.super_TestProblem.super_ColProblem.col_starts_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_3b8.super_TestProblem.super_ColProblem.col_starts_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_3b8.super_TestProblem.super_ColProblem.col_starts_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_3b8.super_TestProblem.super_ColProblem.col_starts_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_3b8);
  return;
}

Assistant:

TEST(SPTest, OrderVarsByStage) {
  TestBasicProblem p(2, 1);
  EXPECT_EQ(mp::var::INTEGER, p.var(1).type());
  p.var(0).set_lb(42);
  p.AddIntSuffix("stage", mp::suf::VAR, 1).SetValue(0, 2);
  mp::SPAdapter sp(p);
  EXPECT_EQ(mp::var::INTEGER, sp.var(0).type());
  EXPECT_EQ(mp::var::CONTINUOUS, sp.var(1).type());
  EXPECT_EQ(42, sp.var(1).lb());
}